

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::EndMark(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_25;
  bool oomRescan;
  AutoFilterExceptionRegion local_14;
  Recycler *pRStack_10;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  Recycler *this_local;
  
  pRStack_10 = this;
  bVar2 = DoQueueTrackedObject(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xae7,"(!this->DoQueueTrackedObject())","!this->DoQueueTrackedObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Empty
                    (&this->clientTrackedObjectList);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xaea,"(this->clientTrackedObjectList.Empty())",
                       "this->clientTrackedObjectList.Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_14,ExceptionType_All);
  if ((this->needExternalWrapperTracing & 1U) != 0) {
    RecyclerCollectionWrapper::EndMarkDomWrapperTracingEnterFinalPauseCallback
              (this->collectionWrapper);
    FinishWrapperObjectTracing(this);
  }
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[5])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_14);
  local_25 = EndMarkCheckOOMRescan(this);
  bVar2 = ProcessObjectBeforeCollectCallbacks(this,false);
  if (bVar2) {
    bVar2 = EndMarkCheckOOMRescan(this);
    local_25 = local_25 || bVar2;
  }
  MarkContext::Cleanup(&this->markContext);
  MarkContext::Cleanup(&this->parallelMarkContext1);
  MarkContext::Cleanup(&this->parallelMarkContext2);
  MarkContext::Cleanup(&this->parallelMarkContext3);
  MarkContext::DecommitPages(&this->markContext);
  MarkContext::DecommitPages(&this->parallelMarkContext1);
  MarkContext::DecommitPages(&this->parallelMarkContext2);
  MarkContext::DecommitPages(&this->parallelMarkContext3);
  return local_25;
}

Assistant:

bool
Recycler::EndMark()
{
#if ENABLE_CONCURRENT_GC
    Assert(!this->DoQueueTrackedObject());
#endif
#if ENABLE_PARTIAL_GC
    Assert(this->clientTrackedObjectList.Empty());
#endif

    {
        // We have finished marking
        AUTO_NO_EXCEPTION_REGION;
        if (this->needExternalWrapperTracing)
        {
            this->collectionWrapper->EndMarkDomWrapperTracingEnterFinalPauseCallback();
            this->FinishWrapperObjectTracing();
        }

        collectionWrapper->EndMarkCallback();
    }

    bool oomRescan = EndMarkCheckOOMRescan();

    if (ProcessObjectBeforeCollectCallbacks())
    {
        // callbacks may trigger additional marking, need to check OOMRescan again
        oomRescan |= EndMarkCheckOOMRescan();
    }

    // GC-CONSIDER: Consider keeping some page around
    GCETW(GC_DECOMMIT_CONCURRENT_COLLECT_PAGE_ALLOCATOR_START, (this));

    // Clean up mark contexts, which will release held free pages
    // Do this for all contexts before we decommit, to make sure all pages are freed
    markContext.Cleanup();
    parallelMarkContext1.Cleanup();
    parallelMarkContext2.Cleanup();
    parallelMarkContext3.Cleanup();

    // Decommit all pages
    markContext.DecommitPages();
    parallelMarkContext1.DecommitPages();
    parallelMarkContext2.DecommitPages();
    parallelMarkContext3.DecommitPages();

    GCETW(GC_DECOMMIT_CONCURRENT_COLLECT_PAGE_ALLOCATOR_STOP, (this));

    return oomRescan;
}